

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O0

void __thiscall
Diffusion::getTensorViscTerms
          (Diffusion *this,MultiFab *visc_terms,Real time,MultiFab **beta,MultiFab *betaCC,
          int betaComp)

{
  AmrLevel *this_00;
  initializer_list<amrex::Geometry> iVar1;
  initializer_list<amrex::BoxArray> iVar2;
  initializer_list<amrex::DistributionMapping> iVar3;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> iVar4;
  initializer_list<std::array<amrex::LinOpBCType,_3UL>_> iVar5;
  initializer_list<std::array<amrex::LinOpBCType,_3UL>_> iVar6;
  initializer_list<amrex::MultiFab_*> iVar7;
  initializer_list<amrex::MultiFab_*> iVar8;
  int *piVar9;
  BoxArray *pBVar10;
  FabFactory<amrex::FArrayBox> *pFVar11;
  Geometry *pGVar12;
  BoxArray *bxs;
  FabFactory<amrex::FArrayBox> *pFVar13;
  long lVar14;
  FabArrayBase *in_RSI;
  long in_RDI;
  int ngrow;
  EBFArrayBoxFactory *ebfactory;
  MultiFab *weights;
  MLMG mlmg;
  NavierStokesBase *crse_ns;
  MultiFab crsedata;
  int i;
  Array<LinOpBCType,_3> mlmg_hibc [3];
  Array<LinOpBCType,_3> mlmg_lobc [3];
  MLEBTensorOp tensorop;
  EBFArrayBoxFactory **ebf;
  LPInfo info;
  Real b;
  Real a;
  MultiFab s_tmp;
  MultiFab visc_tmp;
  int ng;
  MultiFab *S;
  int ncomp;
  int src_comp;
  int allthere;
  int *in_stack_ffffffffffffef88;
  MLLinOp *a_lp;
  MLEBTensorOp *in_stack_ffffffffffffef90;
  undefined4 in_stack_ffffffffffffef98;
  int in_stack_ffffffffffffef9c;
  MLEBABecLap *in_stack_ffffffffffffefa0;
  array<amrex::LinOpBCType,_3UL> *in_stack_ffffffffffffefa8;
  AmrLevel *in_stack_ffffffffffffefb0;
  MultiFab *in_stack_ffffffffffffefb8;
  MLMG *this_01;
  undefined4 in_stack_ffffffffffffefc0;
  undefined4 in_stack_ffffffffffffefc4;
  int iVar15;
  BoxArray *in_stack_ffffffffffffefc8;
  MultiFab *in_stack_ffffffffffffefd0;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *in_stack_ffffffffffffefd8;
  undefined4 in_stack_ffffffffffffefe0;
  undefined4 in_stack_ffffffffffffefe4;
  undefined4 uVar16;
  undefined1 **local_fb0;
  undefined1 **local_f98;
  undefined1 *local_ef8;
  undefined1 **local_ef0;
  undefined8 local_ee8;
  undefined1 *local_ec0;
  Real RVar17;
  MultiFab *in_stack_fffffffffffff158;
  MultiFab *in_stack_fffffffffffff160;
  MultiFab *in_stack_fffffffffffff168;
  int in_stack_fffffffffffff1bc;
  int in_stack_fffffffffffff1c0;
  int in_stack_fffffffffffff1c4;
  Real in_stack_fffffffffffff1c8;
  int in_stack_fffffffffffff1d4;
  MultiFab *in_stack_fffffffffffff1d8;
  _Head_base<0UL,_amrex::MLLinOp_*,_false> in_stack_fffffffffffff1e0;
  int in_stack_fffffffffffff1f0;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff3c8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *in_stack_fffffffffffff3d0;
  MLMG *in_stack_fffffffffffff3d8;
  undefined1 local_b39;
  undefined8 local_b38;
  undefined4 local_b30;
  undefined8 local_b2c;
  undefined4 local_b24;
  undefined8 local_b20;
  undefined4 local_b18;
  undefined8 *local_b10;
  undefined8 local_b08;
  undefined8 local_ae0;
  undefined4 local_ad8;
  undefined8 local_ad4;
  undefined4 local_acc;
  undefined8 local_ac8;
  undefined4 local_ac0;
  undefined8 *local_ab8;
  undefined8 local_ab0;
  int local_a8c;
  undefined8 local_a88;
  undefined4 local_a80;
  undefined8 local_a7c;
  undefined4 local_a74;
  undefined8 local_a70;
  undefined4 local_a68;
  undefined8 local_a58;
  undefined4 local_a50;
  undefined8 local_a4c;
  undefined4 local_a44;
  undefined8 local_a40;
  undefined4 local_a38;
  long local_a30;
  undefined8 *local_a28;
  MultiFab *beta_cc;
  int in_stack_fffffffffffff5ec;
  MultiFab **in_stack_fffffffffffff5f0;
  MLEBTensorOp *in_stack_fffffffffffff5f8;
  Diffusion *in_stack_fffffffffffff600;
  undefined1 *local_9f8 [2];
  undefined8 *local_9e8;
  undefined8 local_9e0;
  undefined8 *local_9b8;
  undefined1 *local_9b0 [13];
  undefined8 *local_948;
  undefined8 local_940;
  undefined1 local_918 [168];
  MultiFab *in_stack_fffffffffffff790;
  MultiFab *in_stack_fffffffffffff798;
  MultiFab *in_stack_fffffffffffff7a0;
  MultiFab *in_stack_fffffffffffff7a8;
  undefined1 *__dest;
  MLCellLinOp *this_02;
  MLLinOp local_828 [2];
  long local_408;
  long *local_400;
  LPInfo local_3f8;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined1 local_398 [400];
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined1 local_1e0 [388];
  undefined4 local_5c;
  MultiFab *local_58;
  int local_50;
  undefined4 local_4c;
  FabArrayBase *local_28;
  char *local_18;
  undefined4 local_c;
  int *local_8;
  
  local_28 = in_RSI;
  checkBeta((Diffusion *)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
            (MultiFab **)in_stack_ffffffffffffef90,in_stack_ffffffffffffef88);
  local_4c = 0;
  local_50 = amrex::FabArrayBase::nComp(local_28);
  if (local_50 < 3) {
    local_18 = "Diffusion::getTensorViscTerms(): visc_terms needs at least BL_SPACEDIM components";
    amrex::Abort_host((char *)in_stack_ffffffffffffefa0);
  }
  local_58 = amrex::AmrLevel::get_data
                       (in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
                        (Real)in_stack_ffffffffffffefa0);
  piVar9 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffef90,
                      (size_type)in_stack_ffffffffffffef88);
  if (*piVar9 == 0) {
    amrex::FabArrayBase::nGrow(local_28,0);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
               (value_type)in_stack_ffffffffffffefb8,(int)((ulong)in_stack_ffffffffffffefb0 >> 0x20)
               ,(int)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20));
  }
  else {
    local_5c = 1;
    local_1f8 = 0;
    uStack_1f0 = 0;
    local_208 = 0;
    uStack_200 = 0;
    local_1e8 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x86aeae);
    amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffef90);
    amrex::MultiFab::MultiFab
              (in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
               (DistributionMapping *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
               (int)((ulong)in_stack_ffffffffffffefb8 >> 0x20),(int)in_stack_ffffffffffffefb8,
               (MFInfo *)in_stack_ffffffffffffefb0,
               (FabFactory<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
    amrex::MFInfo::~MFInfo((MFInfo *)0x86af07);
    local_3b8 = 0;
    uStack_3b0 = 0;
    local_3c8 = 0;
    uStack_3c0 = 0;
    local_3a8 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x86af69);
    pBVar10 = (BoxArray *)amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffef90);
    amrex::MultiFab::MultiFab
              (in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8,
               (DistributionMapping *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
               (int)((ulong)in_stack_ffffffffffffefb8 >> 0x20),(int)in_stack_ffffffffffffefb8,
               (MFInfo *)in_stack_ffffffffffffefb0,
               (FabFactory<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
    amrex::MFInfo::~MFInfo((MFInfo *)0x86afc4);
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              ((FabArray<amrex::FArrayBox> *)in_stack_ffffffffffffef90,(value_type)pBVar10);
    amrex::MultiFab::Copy
              ((MultiFab *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
               in_stack_ffffffffffffefb8,(int)((ulong)in_stack_ffffffffffffefb0 >> 0x20),
               (int)in_stack_ffffffffffffefb0,(int)((ulong)in_stack_ffffffffffffefa8 >> 0x20),
               (int)in_stack_ffffffffffffefa8);
    local_3d0 = 0;
    local_3d8 = 0xbff0000000000000;
    amrex::LPInfo::LPInfo(&local_3f8);
    amrex::LPInfo::setAgglomeration(&local_3f8,(anonymous_namespace)::agglomeration != 0);
    amrex::LPInfo::setConsolidation(&local_3f8,(anonymous_namespace)::consolidation != 0);
    amrex::LPInfo::setMaxCoarseningLevel(&local_3f8,0);
    pFVar11 = amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffef90);
    local_408 = __dynamic_cast(pFVar11,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                               &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (local_408 == 0) {
      __cxa_bad_cast();
    }
    local_400 = &local_408;
    pGVar12 = amrex::AmrLevel::Geom(*(AmrLevel **)(in_RDI + 8));
    __dest = local_918;
    memcpy(__dest,pGVar12,200);
    this_02 = (MLCellLinOp *)0x1;
    std::allocator<amrex::Geometry>::allocator((allocator<amrex::Geometry> *)0x86b12e);
    iVar1._M_array._4_4_ = in_stack_ffffffffffffef9c;
    iVar1._M_array._0_4_ = in_stack_ffffffffffffef98;
    iVar1._M_len = (size_type)in_stack_ffffffffffffefa0;
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_ffffffffffffef90,iVar1,(allocator_type *)pBVar10);
    local_9b8 = local_9b0;
    amrex::BoxArray::BoxArray((BoxArray *)in_stack_ffffffffffffef90,pBVar10);
    local_948 = local_9b0;
    local_940 = 1;
    std::allocator<amrex::BoxArray>::allocator((allocator<amrex::BoxArray> *)0x86b1a9);
    iVar2._M_array._4_4_ = in_stack_ffffffffffffef9c;
    iVar2._M_array._0_4_ = in_stack_ffffffffffffef98;
    iVar2._M_len = (size_type)in_stack_ffffffffffffefa0;
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_ffffffffffffef90,iVar2,(allocator_type *)pBVar10);
    amrex::DistributionMapping::DistributionMapping
              ((DistributionMapping *)in_stack_ffffffffffffef90,(DistributionMapping *)pBVar10);
    local_9e0 = 1;
    local_9e8 = local_9f8;
    std::allocator<amrex::DistributionMapping>::allocator
              ((allocator<amrex::DistributionMapping> *)0x86b222);
    iVar3._M_array._4_4_ = in_stack_ffffffffffffef9c;
    iVar3._M_array._0_4_ = in_stack_ffffffffffffef98;
    iVar3._M_len = (size_type)in_stack_ffffffffffffefa0;
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_ffffffffffffef90,iVar3,(allocator_type *)pBVar10);
    local_a30 = *local_400;
    local_a28 = &local_a30;
    beta_cc = (MultiFab *)0x1;
    std::allocator<const_amrex::EBFArrayBoxFactory_*>::allocator
              ((allocator<const_amrex::EBFArrayBoxFactory_*> *)0x86b28d);
    iVar4._M_array._4_4_ = in_stack_ffffffffffffef9c;
    iVar4._M_array._0_4_ = in_stack_ffffffffffffef98;
    iVar4._M_len = (size_type)in_stack_ffffffffffffefa0;
    amrex::
    Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)in_stack_ffffffffffffef90,iVar4,(allocator_type *)pBVar10);
    amrex::MLEBTensorOp::MLEBTensorOp
              ((MLEBTensorOp *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0),
               in_stack_ffffffffffffefd8,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_ffffffffffffefd0,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               in_stack_ffffffffffffefc8,
               (LPInfo *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)in_stack_ffffffffffffefb8);
    amrex::
    Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    ~Vector((Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
             *)0x86b2f8);
    std::allocator<const_amrex::EBFArrayBoxFactory_*>::~allocator
              ((allocator<const_amrex::EBFArrayBoxFactory_*> *)0x86b305);
    amrex::Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~Vector
              ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               0x86b312);
    std::allocator<amrex::DistributionMapping>::~allocator
              ((allocator<amrex::DistributionMapping> *)0x86b31f);
    local_f98 = (undefined1 **)&local_9e8;
    do {
      local_f98 = local_f98 + -2;
      amrex::DistributionMapping::~DistributionMapping((DistributionMapping *)0x86b354);
    } while (local_f98 != local_9f8);
    amrex::Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~Vector
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x86b37e);
    std::allocator<amrex::BoxArray>::~allocator((allocator<amrex::BoxArray> *)0x86b38b);
    local_fb0 = (undefined1 **)&local_948;
    do {
      local_fb0 = local_fb0 + -0xd;
      amrex::BoxArray::~BoxArray((BoxArray *)in_stack_ffffffffffffef90);
    } while (local_fb0 != local_9b0);
    amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~Vector
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x86b3ea);
    std::allocator<amrex::Geometry>::~allocator((allocator<amrex::Geometry> *)0x86b3f7);
    amrex::MLLinOp::setMaxOrder(local_828,tensor_max_order);
    for (local_a8c = 0; iVar15 = (int)((ulong)__dest >> 0x20), local_a8c < 3;
        local_a8c = local_a8c + 1) {
      setDomainBC((Diffusion *)in_stack_ffffffffffffefb0,in_stack_ffffffffffffefa8,
                  (array<amrex::LinOpBCType,_3UL> *)in_stack_ffffffffffffefa0,
                  in_stack_ffffffffffffef9c);
    }
    local_ad8 = local_a50;
    local_ae0 = local_a58;
    local_acc = local_a44;
    local_ad4 = local_a4c;
    local_ac0 = local_a38;
    local_ac8 = local_a40;
    local_ab8 = &local_ae0;
    local_ab0 = 3;
    std::allocator<std::array<amrex::LinOpBCType,_3UL>_>::allocator
              ((allocator<std::array<amrex::LinOpBCType,_3UL>_> *)0x86b75a);
    iVar5._M_array._4_4_ = in_stack_ffffffffffffef9c;
    iVar5._M_array._0_4_ = in_stack_ffffffffffffef98;
    iVar5._M_len = (size_type)in_stack_ffffffffffffefa0;
    amrex::
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)in_stack_ffffffffffffef90,iVar5,(allocator_type *)pBVar10);
    local_b30 = local_a80;
    local_b38 = local_a88;
    local_b24 = local_a74;
    local_b2c = local_a7c;
    local_b18 = local_a68;
    local_b20 = local_a70;
    local_b10 = &local_b38;
    local_b08 = 3;
    pFVar11 = (FabFactory<amrex::FArrayBox> *)&local_b39;
    std::allocator<std::array<amrex::LinOpBCType,_3UL>_>::allocator
              ((allocator<std::array<amrex::LinOpBCType,_3UL>_> *)0x86b806);
    iVar6._M_array._4_4_ = in_stack_ffffffffffffef9c;
    iVar6._M_array._0_4_ = in_stack_ffffffffffffef98;
    iVar6._M_len = (size_type)in_stack_ffffffffffffefa0;
    amrex::
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              *)in_stack_ffffffffffffef90,iVar6,(allocator_type *)pBVar10);
    amrex::MLLinOp::setDomainBC
              ((MLLinOp *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),
               (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)in_stack_ffffffffffffefb8,
               (Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)in_stack_ffffffffffffefb0);
    amrex::
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::~Vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               *)0x86b854);
    std::allocator<std::array<amrex::LinOpBCType,_3UL>_>::~allocator
              ((allocator<std::array<amrex::LinOpBCType,_3UL>_> *)0x86b861);
    amrex::
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::~Vector((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               *)0x86b86e);
    std::allocator<std::array<amrex::LinOpBCType,_3UL>_>::~allocator
              ((allocator<std::array<amrex::LinOpBCType,_3UL>_> *)0x86b87b);
    amrex::MultiFab::MultiFab((MultiFab *)in_stack_ffffffffffffef90);
    if (0 < *(int *)(in_RDI + 0x20)) {
      this_00 = *(AmrLevel **)(*(long *)(in_RDI + 0x28) + 8);
      pBVar10 = amrex::AmrLevel::boxArray(this_00);
      bxs = (BoxArray *)amrex::AmrLevel::DistributionMap(this_00);
      uVar16 = local_5c;
      amrex::MFInfo::MFInfo((MFInfo *)0x86b912);
      pFVar13 = amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffef90);
      amrex::MultiFab::define
                ((MultiFab *)CONCAT44(uVar16,in_stack_ffffffffffffefe0),bxs,
                 (DistributionMapping *)pBVar10,(int)((ulong)in_stack_ffffffffffffefc8 >> 0x20),
                 (int)in_stack_ffffffffffffefc8,
                 (MFInfo *)CONCAT44(in_stack_ffffffffffffefc4,in_stack_ffffffffffffefc0),pFVar11);
      amrex::MFInfo::~MFInfo((MFInfo *)0x86b95d);
      pBVar10 = (BoxArray *)((ulong)pFVar13 & 0xffffffff00000000);
      amrex::AmrLevel::FillPatch
                ((AmrLevel *)in_stack_fffffffffffff1e0._M_head_impl,in_stack_fffffffffffff1d8,
                 in_stack_fffffffffffff1d4,in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c4,
                 in_stack_fffffffffffff1c0,in_stack_fffffffffffff1bc,in_stack_fffffffffffff1f0);
      local_8 = (int *)(in_RDI + 0x3c);
      local_c = 0;
      amrex::MLLinOp::setCoarseFineBC(local_828,(MultiFab *)&stack0xfffffffffffff340,*local_8);
    }
    a_lp = (MLLinOp *)((ulong)pBVar10 & 0xffffffff00000000);
    amrex::AmrLevel::FillPatch
              ((AmrLevel *)in_stack_fffffffffffff1e0._M_head_impl,in_stack_fffffffffffff1d8,
               in_stack_fffffffffffff1d4,in_stack_fffffffffffff1c8,in_stack_fffffffffffff1c4,
               in_stack_fffffffffffff1c0,in_stack_fffffffffffff1bc,in_stack_fffffffffffff1f0);
    amrex::MLCellLinOp::setLevelBC
              (this_02,iVar15,in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
               in_stack_fffffffffffff798,in_stack_fffffffffffff790);
    amrex::MultiFab::~MultiFab((MultiFab *)0x86bae9);
    amrex::MLEBABecLap::setScalars
              (in_stack_ffffffffffffefa0,
               (Real)CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98),
               (Real)in_stack_ffffffffffffef90);
    setViscosity(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,
                 in_stack_fffffffffffff5ec,beta_cc);
    amrex::MLMG::MLMG((MLMG *)in_stack_ffffffffffffef90,a_lp);
    this_01 = (MLMG *)&stack0xfffffffffffff170;
    amrex::MLMG::setMaxFmgIter(this_01,(anonymous_namespace)::max_fmg_iter);
    iVar15 = 10;
    amrex::MLMG::setVerbose(this_01,10);
    amrex::MLMG::setBottomVerbose(this_01,iVar15);
    local_ec0 = local_1e0;
    pGVar12 = (Geometry *)&local_ec0;
    RVar17 = 4.94065645841247e-324;
    std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x86bbbf);
    iVar7._M_array._4_4_ = in_stack_ffffffffffffef9c;
    iVar7._M_array._0_4_ = in_stack_ffffffffffffef98;
    iVar7._M_len = (size_type)in_stack_ffffffffffffefa0;
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_ffffffffffffef90,iVar7,(allocator_type *)a_lp);
    local_ef8 = local_398;
    local_ef0 = &local_ef8;
    local_ee8 = 1;
    std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x86bc21);
    iVar8._M_array._4_4_ = in_stack_ffffffffffffef9c;
    iVar8._M_array._0_4_ = in_stack_ffffffffffffef98;
    iVar8._M_len = (size_type)in_stack_ffffffffffffefa0;
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
               in_stack_ffffffffffffef90,iVar8,(allocator_type *)a_lp);
    amrex::MLMG::apply(in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0,in_stack_fffffffffffff3c8
                      );
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x86bc71);
    std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x86bc7e);
    amrex::Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~Vector
              ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x86bc8b);
    std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x86bc98);
    amrex::MLMG::~MLMG((MLMG *)in_stack_ffffffffffffef90);
    amrex::MLEBTensorOp::~MLEBTensorOp(in_stack_ffffffffffffef90);
    pFVar11 = amrex::AmrLevel::Factory((AmrLevel *)in_stack_ffffffffffffef90);
    lVar14 = __dynamic_cast(pFVar11,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                            &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (lVar14 == 0) {
      __cxa_bad_cast();
    }
    amrex::EBFArrayBoxFactory::getVolFrac((EBFArrayBoxFactory *)in_stack_ffffffffffffef90);
    amrex::AmrLevel::Geom(*(AmrLevel **)(in_RDI + 8));
    amrex::single_level_weighted_redistribute
              (in_stack_fffffffffffff168,in_stack_fffffffffffff160,in_stack_fffffffffffff158,
               (int)((ulong)RVar17 >> 0x20),SUB84(RVar17,0),pGVar12);
    amrex::MultiFab::~MultiFab((MultiFab *)0x86bd70);
    amrex::MultiFab::~MultiFab((MultiFab *)0x86bd7d);
  }
  return;
}

Assistant:

void
Diffusion::getTensorViscTerms (MultiFab&              visc_terms,
                               Real                   time,
                               const MultiFab* const* beta,
                               const MultiFab* const  betaCC,
                               int                    betaComp)
{
    int allthere;
    checkBeta(beta, allthere);

    const int src_comp = Xvel;
    const int ncomp    = visc_terms.nComp();

    if (ncomp < AMREX_SPACEDIM)
        amrex::Abort("Diffusion::getTensorViscTerms(): visc_terms needs at least BL_SPACEDIM components");
    //
    // Before computing the godunov predicitors we may have to
    // precompute the viscous source terms.  To do this we must
    // construct a Laplacian operator, set the coeficients and apply
    // it to the time N data.  First, however, we must precompute the
    // fine N bndry values.  We will do this for each scalar that diffuses.
    //
    // Note: This routine DOES NOT fill grow cells
    //
    MultiFab&   S    = navier_stokes->get_data(State_Type,time);

    if (is_diffusive[src_comp])
    {
        int ng = 1;
        MultiFab visc_tmp(grids,dmap,AMREX_SPACEDIM,2,MFInfo(),navier_stokes->Factory()),
                 s_tmp(grids,dmap,AMREX_SPACEDIM,ng,MFInfo(),navier_stokes->Factory());
        visc_tmp.setVal(0.);
        MultiFab::Copy(s_tmp,S,Xvel,0,AMREX_SPACEDIM,0);

        //
        // Set up operator and apply to compute viscous terms.
        //
        const Real a = 0.0;
        const Real b = -1.0;

        // MLMG tensor solver
        {
           LPInfo info;
           info.setAgglomeration(agglomeration);
           info.setConsolidation(consolidation);
           info.setMaxCoarseningLevel(0);

#ifdef AMREX_USE_EB
           const auto& ebf = &dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
           MLEBTensorOp tensorop({navier_stokes->Geom()}, {grids}, {dmap}, info, {ebf});
#else
           MLTensorOp tensorop({navier_stokes->Geom()}, {grids}, {dmap}, info);
#endif
           tensorop.setMaxOrder(tensor_max_order);

           // create right container
           Array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc[AMREX_SPACEDIM];
           Array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc[AMREX_SPACEDIM];
           // fill it
           for (int i=0; i<AMREX_SPACEDIM; i++)
             setDomainBC(mlmg_lobc[i], mlmg_hibc[i], Xvel+i);
           // pass to op
           tensorop.setDomainBC({AMREX_D_DECL(mlmg_lobc[0],mlmg_lobc[1],mlmg_lobc[2])},
                                {AMREX_D_DECL(mlmg_hibc[0],mlmg_hibc[1],mlmg_hibc[2])});

           // set coarse-fine BCs
           {
              MultiFab crsedata;

              if (level > 0) {
                auto& crse_ns = *(coarser->navier_stokes);
                crsedata.define(crse_ns.boxArray(), crse_ns.DistributionMap(),
                                AMREX_SPACEDIM, ng, MFInfo(),crse_ns.Factory());
                AmrLevel::FillPatch(crse_ns, crsedata, ng, time, State_Type, Xvel,
                                    AMREX_SPACEDIM);
                tensorop.setCoarseFineBC(&crsedata, crse_ratio[0]);
              }
              AmrLevel::FillPatch(*navier_stokes,s_tmp,ng,time,State_Type,Xvel,AMREX_SPACEDIM);
              tensorop.setLevelBC(0, &s_tmp);

              // FIXME: check divergence of vel
              // MLNodeLaplacian mllap({navier_stokes->Geom()}, {grids}, {dmap}, info);
              // mllap.setDomainBC(mlmg_lobc[0], mlmg_hibc[0]);
              // Rhs2.setVal(0.);
              // mllap.compDivergence({&Rhs2}, {&s_tmp});
              // amrex::WriteSingleLevelPlotfile("div_"+std::to_string(count), Rhs2, {AMREX_D_DECL("x","y","z")},navier_stokes->Geom(), 0.0, 0);
              //
           }

           tensorop.setScalars(a, b);

#ifdef AMREX_USE_EB
           setViscosity(tensorop, beta, betaComp, *betaCC);
#else
           amrex::ignore_unused(betaCC);
           setViscosity(tensorop, beta, betaComp);
#endif

           MLMG mlmg(tensorop);
           // FIXME -- consider making new parameters max_iter and bottom_verbose
           //mlmg.setMaxIter(max_iter);
           mlmg.setMaxFmgIter(max_fmg_iter);
           mlmg.setVerbose(10);
           mlmg.setBottomVerbose(10);
           //mlmg.setBottomVerbose(bottom_verbose);

           mlmg.apply({&visc_tmp}, {&s_tmp});
        }

#ifdef AMREX_USE_EB
        const amrex::MultiFab* weights;
        const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
        weights = &(ebfactory.getVolFrac());
        amrex::single_level_weighted_redistribute(visc_tmp, visc_terms, *weights, 0, AMREX_SPACEDIM,
                                                  navier_stokes->Geom() );
#else
        MultiFab::Copy(visc_terms,visc_tmp,0,0,AMREX_SPACEDIM,0);
#endif
    }
    else
    {
        int ngrow = visc_terms.nGrow();
        visc_terms.setVal(0.0,src_comp,AMREX_SPACEDIM,ngrow);
    }
}